

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayFeatureExtractor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ArrayFeatureExtractor::InternalSwap
          (ArrayFeatureExtractor *this,ArrayFeatureExtractor *other)

{
  ArrayFeatureExtractor *other_local;
  ArrayFeatureExtractor *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->extractindex_,&other->extractindex_);
  return;
}

Assistant:

void ArrayFeatureExtractor::InternalSwap(ArrayFeatureExtractor* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  extractindex_.InternalSwap(&other->extractindex_);
}